

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eh-utils.cpp
# Opt level: O1

void wasm::EHUtils::handleBlockNestedPop(Try *try_,Function *func,Module *wasm)

{
  Name *pNVar1;
  uintptr_t uVar2;
  undefined1 auVar3 [16];
  Expression **ppEVar4;
  Tag *pTVar5;
  Expression *value;
  LocalSet *left;
  Block *pBVar6;
  Expression *pEVar7;
  ulong uVar8;
  uint uVar9;
  Type in_R8;
  ulong uVar10;
  Name name;
  Signature SVar11;
  optional<wasm::Type> type;
  Expression **local_50;
  Expression **popPtr;
  Builder local_40;
  Builder builder;
  bool isPopNested;
  
  if ((try_->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements != 0
     ) {
    uVar9 = 1;
    uVar10 = 0;
    local_40.wasm = wasm;
    do {
      pNVar1 = (try_->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
      name.super_IString.str._M_str = pNVar1[uVar10].super_IString.str._M_str;
      name.super_IString.str._M_len = pNVar1[uVar10].super_IString.str._M_len;
      pTVar5 = Module::getTag(wasm,name);
      SVar11 = HeapType::getSignature(&pTVar5->type);
      if (SVar11.params.id.id != 0) {
        if ((try_->catchBodies).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar10) {
LAB_006bdae7:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        pEVar7 = (try_->catchBodies).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                 [uVar10];
        builder.wasm._7_1_ = '\0';
        local_50 = (Expression **)0x0;
        value = getFirstPop(pEVar7,(bool *)((long)&builder.wasm + 7),&local_50);
        ppEVar4 = local_50;
        if (value == (Expression *)0x0) {
          __assert_fail("pop && \"Pop has not been found in this catch\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/eh-utils.cpp"
                        ,0x7a,
                        "void wasm::EHUtils::handleBlockNestedPop(Try *, Function *, Module &)");
        }
        if (builder.wasm._7_1_ == '\x01') {
          if (local_50 == (Expression **)0x0) {
            __assert_fail("popPtr",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/eh-utils.cpp"
                          ,0x8e,
                          "void wasm::EHUtils::handleBlockNestedPop(Try *, Function *, Module &)");
          }
          uVar8 = (value->type).id;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar8;
          popPtr._4_4_ = Builder::addVar((Builder *)func,(Function *)0x0,(Name)(auVar3 << 0x40),
                                         in_R8);
          left = Builder::makeLocalSet(&local_40,popPtr._4_4_,value);
          in_R8.id = 0;
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar8;
          pBVar6 = Builder::makeSequence(&local_40,(Expression *)left,pEVar7,type);
          if ((try_->catchBodies).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements <= uVar10) goto LAB_006bdae7;
          (try_->catchBodies).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data[uVar10] =
               (Expression *)pBVar6;
          uVar2 = (value->type).id;
          pEVar7 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
          pEVar7->_id = LocalGetId;
          *(Index *)(pEVar7 + 1) = popPtr._4_4_;
          (pEVar7->type).id = uVar2;
          *ppEVar4 = pEVar7;
        }
      }
      uVar10 = (ulong)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar10 < (try_->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                      usedElements);
  }
  return;
}

Assistant:

void handleBlockNestedPop(Try* try_, Function* func, Module& wasm) {
  Builder builder(wasm);
  for (Index i = 0; i < try_->catchTags.size(); i++) {
    Name tagName = try_->catchTags[i];
    auto* tag = wasm.getTag(tagName);
    if (tag->params() == Type::none) {
      continue;
    }

    auto* catchBody = try_->catchBodies[i];
    bool isPopNested = false;
    Expression** popPtr = nullptr;
    Expression* pop = getFirstPop(catchBody, isPopNested, popPtr);
    assert(pop && "Pop has not been found in this catch");

    // Change code like
    // (catch $e
    //   ...
    //   (block
    //     (pop i32)
    //   )
    // )
    // into
    // (catch $e
    //   (local.set $new
    //     (pop i32)
    //   )
    //   ...
    //   (block
    //     (local.get $new)
    //   )
    // )
    if (isPopNested) {
      assert(popPtr);
      Index newLocal = builder.addVar(func, pop->type);
      try_->catchBodies[i] =
        builder.makeSequence(builder.makeLocalSet(newLocal, pop), catchBody);
      *popPtr = builder.makeLocalGet(newLocal, pop->type);
    }
  }
}